

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_portals.cxx
# Opt level: O1

void __thiscall read_portal_v8::operator()(read_portal_v8 *this,portal_data **_portal,xr_reader *r)

{
  uint16_t *puVar1;
  uint32_t *puVar2;
  portal_data *ppVar3;
  portal_data *ppVar4;
  float *pfVar5;
  portal_data *ppVar6;
  long lVar7;
  
  ppVar4 = (portal_data *)operator_new(0x50);
  (ppVar4->vertices).count = 0;
  *_portal = ppVar4;
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  ppVar4->sector_front = *puVar1;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 2);
  ppVar4->sector_back = puVar1[1];
  pfVar5 = (float *)(puVar1 + 4);
  lVar7 = 6;
  ppVar3 = ppVar4;
  do {
    ppVar6 = (portal_data *)((ppVar3->vertices).array[0].field_0.xyz + 2);
    (r->field_2).m_p_u32 = (uint32_t *)pfVar5;
    (ppVar3->vertices).array[0].field_0.field_0.x = pfVar5[-1];
    (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
    (ppVar3->vertices).array[0].field_0.field_0.y = *pfVar5;
    (r->field_2).m_p = (uint8_t *)(pfVar5 + 2);
    *(float *)ppVar6 = pfVar5[1];
    pfVar5 = pfVar5 + 3;
    lVar7 = lVar7 + -1;
    ppVar3 = ppVar6;
  } while (lVar7 != 0);
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  (ppVar4->vertices).count = *puVar2;
  return;
}

Assistant:

void operator()(portal_data*& _portal, xr_reader& r) const {
	portal_data* portal = new portal_data;
	_portal = portal;
	portal->sector_front = r.r_u16();
	portal->sector_back = r.r_u16();
	for (uint_fast32_t i = 0; i != 6; ++i)
		r.r_fvector3(portal->vertices.array[i]);
	portal->vertices.count = r.r_u32();
}